

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cpp
# Opt level: O0

void __thiscall Sonne::Config::Write(Config *this,string *path)

{
  _Setw _Var1;
  ostream *o;
  ostream local_228 [8];
  ofstream out;
  undefined1 local_28 [8];
  json configObject;
  string *path_local;
  Config *this_local;
  
  configObject.m_value = (json_value)path;
  _ConstructConfigJSON_abi_cxx11_((Config *)local_28);
  std::ofstream::ofstream(local_228,configObject.m_value.object,0x10);
  _Var1 = std::setw(4);
  o = std::operator<<(local_228,_Var1);
  nlohmann::operator<<
            (o,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)local_28);
  std::ofstream::close();
  std::ofstream::~ofstream(local_228);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 *)local_28);
  return;
}

Assistant:

void Config::Write(const std::string& path)
{
    nlohmann::json configObject = _ConstructConfigJSON();

    std::ofstream out(path);

    out << std::setw(4) << configObject;

    out.close();
}